

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

void __thiscall
efsw::FileWatcherGeneric::FileWatcherGeneric(FileWatcherGeneric *this,FileWatcher *parent)

{
  FileWatcher *parent_local;
  FileWatcherGeneric *this_local;
  
  FileWatcherImpl::FileWatcherImpl(&this->super_FileWatcherImpl,parent);
  (this->super_FileWatcherImpl)._vptr_FileWatcherImpl =
       (_func_int **)&PTR__FileWatcherGeneric_00142a98;
  this->mThread = (Thread *)0x0;
  this->mLastWatchID = 0;
  std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::vector
            (&this->mWatches);
  Mutex::Mutex(&this->mWatchesLock);
  Atomic<bool>::operator=(&(this->super_FileWatcherImpl).mInitOK,true);
  (this->super_FileWatcherImpl).mIsGeneric = true;
  return;
}

Assistant:

FileWatcherGeneric::FileWatcherGeneric( FileWatcher* parent ) :
	FileWatcherImpl( parent ), mThread( NULL ), mLastWatchID( 0 ) {
	mInitOK = true;
	mIsGeneric = true;
}